

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir_nav_kernel_2.h
# Opt level: O0

type dlib::
     directory_helper_get_files<dlib::queue_kernel_c<dlib::queue_kernel_1<dlib::file,dlib::memory_manager_stateless_kernel_1<char>>>>
               (data *state,
               queue_kernel_c<dlib::queue_kernel_1<dlib::file,_dlib::memory_manager_stateless_kernel_1<char>_>_>
               *files)

{
  queue_kernel_1<dlib::file,_dlib::memory_manager_stateless_kernel_1<char>_> *pqVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  long lVar5;
  undefined8 uVar6;
  char *pcVar7;
  DIR *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  int *piVar8;
  long in_RDI;
  file temp_1;
  time_point last_modified;
  ssize_t temp;
  char buf [4096];
  uint64 file_size;
  string path;
  stat64 buffer;
  dirent *data;
  DIR *ffind;
  string *in_stack_ffffffffffffecf8;
  undefined4 in_stack_ffffffffffffed00;
  undefined4 in_stack_ffffffffffffed04;
  char *in_stack_ffffffffffffed08;
  file *in_stack_ffffffffffffed18;
  queue_kernel_1<dlib::file,_dlib::memory_manager_stateless_kernel_1<char>_>
  *in_stack_ffffffffffffed20;
  undefined4 in_stack_ffffffffffffed28;
  int in_stack_ffffffffffffed2c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffed40;
  string local_1278 [39];
  allocator local_1251;
  string local_1250 [32];
  file local_1230;
  duration local_11e0;
  undefined1 local_11d1;
  string local_11b0 [32];
  queue_kernel_1<dlib::file,_dlib::memory_manager_stateless_kernel_1<char>_> *local_1190;
  char local_1188 [4104];
  string local_180 [32];
  queue_kernel_1<dlib::file,_dlib::memory_manager_stateless_kernel_1<char>_> *local_160;
  undefined1 local_151;
  undefined1 local_129;
  string local_108 [32];
  stat64 local_e8;
  dirent *local_58;
  DIR *local_50;
  undefined1 local_45;
  allocator local_31;
  string local_30 [40];
  long local_8;
  
  local_8 = in_RDI;
  queue_kernel_1<dlib::file,_dlib::memory_manager_stateless_kernel_1<char>_>::clear
            ((queue_kernel_1<dlib::file,_dlib::memory_manager_stateless_kernel_1<char>_> *)
             CONCAT44(in_stack_ffffffffffffed04,in_stack_ffffffffffffed00));
  lVar5 = std::__cxx11::string::size();
  if (lVar5 == 0) {
    local_45 = 1;
    uVar6 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_30,"This directory object currently doesn\'t represent any directory.",
               &local_31);
    directory::listing_error::listing_error
              ((listing_error *)CONCAT44(in_stack_ffffffffffffed04,in_stack_ffffffffffffed00),
               in_stack_ffffffffffffecf8);
    local_45 = 0;
    __cxa_throw(uVar6,&directory::listing_error::typeinfo,directory::listing_error::~listing_error);
  }
  local_50 = (DIR *)0x0;
  std::__cxx11::string::string(local_108,(string *)(local_8 + 0x20));
  std::__cxx11::string::size();
  pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_108);
  cVar3 = *pcVar7;
  cVar2 = directory::get_separator();
  if (cVar3 != cVar2) {
    cVar3 = directory::get_separator();
    std::__cxx11::string::operator+=(local_108,cVar3);
  }
  pcVar7 = (char *)std::__cxx11::string::c_str();
  __lhs = opendir(pcVar7);
  local_50 = __lhs;
  if (__lhs == (DIR *)0x0) {
    local_129 = 1;
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x30);
    std::operator+((char *)__lhs,__rhs);
    directory::listing_error::listing_error
              ((listing_error *)CONCAT44(in_stack_ffffffffffffed04,in_stack_ffffffffffffed00),
               in_stack_ffffffffffffecf8);
    local_129 = 0;
    __cxa_throw(__rhs,&directory::listing_error::typeinfo,directory::listing_error::~listing_error);
  }
  while( true ) {
    piVar8 = __errno_location();
    *piVar8 = 0;
    local_58 = readdir(local_50);
    if (local_58 == (dirent *)0x0) break;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28),
                   (char *)in_stack_ffffffffffffed20);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    in_stack_ffffffffffffed2c = stat64(pcVar7,&local_e8);
    std::__cxx11::string::~string(local_180);
    if (in_stack_ffffffffffffed2c == 0) {
      local_160 = (queue_kernel_1<dlib::file,_dlib::memory_manager_stateless_kernel_1<char>_> *)
                  local_e8.st_size;
      pqVar1 = local_160;
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28),
                     (char *)in_stack_ffffffffffffed20);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      in_stack_ffffffffffffed20 =
           (queue_kernel_1<dlib::file,_dlib::memory_manager_stateless_kernel_1<char>_> *)
           readlink(pcVar7,local_1188,0x1000);
      std::__cxx11::string::~string(local_11b0);
      local_1190 = in_stack_ffffffffffffed20;
      pqVar1 = in_stack_ffffffffffffed20;
      if (in_stack_ffffffffffffed20 ==
          (queue_kernel_1<dlib::file,_dlib::memory_manager_stateless_kernel_1<char>_> *)
          0xffffffffffffffff) {
        local_11d1 = 1;
        uVar6 = __cxa_allocate_exception(0x30);
        std::operator+((char *)__lhs,in_stack_ffffffffffffed40);
        directory::listing_error::listing_error
                  ((listing_error *)CONCAT44(in_stack_ffffffffffffed04,in_stack_ffffffffffffed00),
                   in_stack_ffffffffffffecf8);
        local_11d1 = 0;
        __cxa_throw(uVar6,&directory::listing_error::typeinfo,
                    directory::listing_error::~listing_error);
      }
    }
    local_160 = pqVar1;
    local_11e0.__r =
         (rep)std::chrono::_V2::system_clock::from_time_t((time_t)in_stack_ffffffffffffed08);
    if ((local_e8.st_mode & 0xf000) != 0x4000) {
      in_stack_ffffffffffffed08 = local_58->d_name;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1250,in_stack_ffffffffffffed08,&local_1251);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffed2c,in_stack_ffffffffffffed28),
                     (char *)in_stack_ffffffffffffed20);
      file::file(&local_1230,local_1250,local_1278,local_160,&local_11e0);
      std::__cxx11::string::~string(local_1278);
      std::__cxx11::string::~string(local_1250);
      std::allocator<char>::~allocator((allocator<char> *)&local_1251);
      queue_kernel_1<dlib::file,_dlib::memory_manager_stateless_kernel_1<char>_>::enqueue
                (in_stack_ffffffffffffed20,in_stack_ffffffffffffed18);
      file::~file((file *)0x4877e0);
    }
  }
  piVar8 = __errno_location();
  if (*piVar8 != 0) {
    local_151 = 1;
    uVar6 = __cxa_allocate_exception(0x30);
    std::operator+((char *)__lhs,in_stack_ffffffffffffed40);
    directory::listing_error::listing_error
              ((listing_error *)CONCAT44(in_stack_ffffffffffffed04,in_stack_ffffffffffffed00),
               in_stack_ffffffffffffecf8);
    local_151 = 0;
    __cxa_throw(uVar6,&directory::listing_error::typeinfo,directory::listing_error::~listing_error);
  }
  if (local_50 != (DIR *)0x0) {
    do {
      iVar4 = closedir(local_50);
      if (iVar4 == 0) break;
      piVar8 = __errno_location();
    } while (*piVar8 == 4);
    local_50 = (DIR *)0x0;
  }
  std::__cxx11::string::~string(local_108);
  return;
}

Assistant:

typename disable_if<is_std_vector<queue_of_files>,void>::type
    directory_helper_get_files (
        const directory::data& state,
        queue_of_files& files
    ) 
    {
        using namespace std;

        files.clear();
        if (state.full_name.size() == 0)
            throw directory::listing_error("This directory object currently doesn't represent any directory.");

        DIR* ffind = 0;
        struct dirent* data;
        struct stat64 buffer;

        try
        {
            string path = state.full_name;
            // ensure that the path ends with a separator
            if (path[path.size()-1] != directory::get_separator())
                path += directory::get_separator();

            // get a handle to something we can search with
            ffind = opendir(state.full_name.c_str());
            if (ffind == 0)
            {
                throw directory::listing_error("Unable to list the contents of " + state.full_name);
            }

            while(true)
            {
                errno = 0;
                if ( (data = readdir(ffind)) == 0)
                {                    
                    // there was an error or no more files
                    if ( errno == 0)
                    {
                        // there are no more files
                        break;
                    }
                    else
                    {
                        // there was an error
                        throw directory::listing_error("Unable to list the contents of " + state.full_name);
                    }                
                }

                uint64 file_size;
                // get a stat64 structure so we can see if this is a file
                if (::stat64((path+data->d_name).c_str(), &buffer) != 0)
                {
                    // this might be a broken symbolic link.  We can check by calling
                    // readlink and seeing if it finds anything.  
                    char buf[PATH_MAX];
                    ssize_t temp = readlink((path+data->d_name).c_str(),buf,sizeof(buf));
                    if (temp == -1)                    
                        throw directory::listing_error("Unable to list the contents of " + state.full_name);
                    else
                        file_size = static_cast<uint64>(temp);
                }
                else
                {
                    file_size = static_cast<uint64>(buffer.st_size);
                }
                auto last_modified = std::chrono::system_clock::from_time_t(buffer.st_mtime);
#ifdef _BSD_SOURCE 
                last_modified += std::chrono::nanoseconds(buffer.st_atim.tv_nsec);
#endif

                if (S_ISDIR(buffer.st_mode) == 0)
                {
                    // this is actually a file
                    file temp(
                        data->d_name,
                        path+data->d_name,
                        file_size,
                        last_modified,
                        file::private_constructor()
                        );
                    files.enqueue(temp);
                }
            } // while (true)

            if (ffind != 0)
            {
                while (closedir(ffind))
                {
                    if (errno != EINTR)
                        break;
                }
                ffind = 0;
            }

        }
        catch (...)
        {
            if (ffind != 0)
            {
                while (closedir(ffind))
                {
                    if (errno != EINTR)
                        break;
                }
                ffind = 0;
            }
            files.clear();
            throw;
        }
    }